

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall cmFindBase::FillSystemEnvironmentPath(cmFindBase *this)

{
  cmSearchPath *this_00;
  ulong uVar1;
  allocator<char> local_39;
  string local_38;
  cmSearchPath *local_18;
  cmSearchPath *paths;
  cmFindBase *this_local;
  
  paths = (cmSearchPath *)this;
  local_18 = std::
             map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
             ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                          &cmFindCommon::PathLabel::SystemEnvironment);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmSearchPath::AddEnvPath(local_18,&this->EnvironmentPath);
  }
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"PATH",&local_39);
  cmSearchPath::AddEnvPath(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  cmSearchPath::AddSuffixes(local_18,&(this->super_cmFindCommon).SearchPathSuffixes);
  return;
}

Assistant:

void cmFindBase::FillSystemEnvironmentPath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::SystemEnvironment];

  // Add LIB or INCLUDE
  if (!this->EnvironmentPath.empty()) {
    paths.AddEnvPath(this->EnvironmentPath);
#if defined(_WIN32) || defined(__CYGWIN__)
    paths.AddEnvPrefixPath("PATH", true);
#endif
  }
  // Add PATH
  paths.AddEnvPath("PATH");
  paths.AddSuffixes(this->SearchPathSuffixes);
}